

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_query.cpp
# Opt level: O0

void __thiscall create::SerialQuery::processByte(SerialQuery *this,uint8_t byteRead)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined1 local_48 [32];
  undefined1 local_28 [31];
  uint8_t byteRead_local;
  SerialQuery *this_local;
  
  this->packetData = this->packetData | (ushort)byteRead << ((this->packetByte & 3U) << 3);
  if (this->packetByte < '\x01') {
    local_28[0x17] = byteRead;
    unique0x100001de = this;
    if (this->packetID < this->maxPacketID) {
      peVar1 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_Serial).data);
      Data::getPacket((Data *)local_28,(uint8_t)peVar1);
      peVar2 = std::__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      Packet::setDataToValidate(peVar2,&this->packetData);
      std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_28);
      this->packetData = 0;
      this->packetID = this->packetID + '\x01';
      peVar1 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_Serial).data);
      Data::getPacket((Data *)local_48,(uint8_t)peVar1);
      peVar2 = std::__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      this->packetByte = peVar2->nbytes + 0xff;
      std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_48);
    }
    else {
      this->packetID = '\a';
      this->packetByte = '\0';
      this->packetData = 0;
      Serial::notifyDataReady(&this->super_Serial);
      requestSensorData(this);
    }
  }
  else {
    this->packetByte = this->packetByte + -1;
  }
  return;
}

Assistant:

void SerialQuery::processByte(uint8_t byteRead) {
    packetData |= (static_cast<uint16_t>(byteRead) << (8 * packetByte));

    if (packetByte > 0) {
      --packetByte;
    } else if (packetID < maxPacketID) {
      // New packet
      data->getPacket(packetID)->setDataToValidate(packetData);
      packetData = 0;
      ++packetID;
      packetByte = data->getPacket(packetID)->nbytes - 1;
    } else {
      // Response finished
      packetID = ID_BUMP_WHEELDROP;
      packetByte = 0;
      packetData = 0;
      notifyDataReady();
      requestSensorData();
    }
  }